

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::DeadStoreInstr(BackwardPass *this,Instr *instr)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  PropertySym *pPVar2;
  Opnd *this_00;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ArgSlot AVar6;
  RegSlot RVar7;
  StackSym *pSVar8;
  Func *pFVar9;
  StackSym **ppSVar10;
  BVSparseNode *pBVar11;
  PropertySym *pPVar12;
  undefined4 *puVar13;
  JITTimeFunctionBody *this_01;
  BVSparseNode *pBVar14;
  PropertySym *pPVar15;
  Type pBVar16;
  BasicBlock *this_02;
  ulong uVar17;
  ulong uVar18;
  PropertySym *local_b0;
  PropertySym *unusedPropertySym;
  Type_conflict pBStack_a0;
  JitArenaAllocator *local_98;
  PropertySym **local_90;
  ulong local_80;
  Instr *local_78;
  BasicBlock *local_70;
  BVSparse<Memory::JitArenaAllocator> local_68;
  BVSparseNode *local_40;
  undefined4 *local_38;
  
  this_02 = this->currentBlock;
  bVar4 = IsTraceEnabled(this);
  if (bVar4) {
    Output::Print(L"Deadstore instr: ");
    IR::Instr::Dump(instr);
  }
  this->numDeadStore = this->numDeadStore + 1;
  bVar4 = DoByteCodeUpwardExposedUsed(this);
  if (bVar4) {
    local_98 = this->tempAlloc;
    local_90 = &unusedPropertySym;
    unusedPropertySym = (PropertySym *)0x0;
    pBStack_a0 = (Type_conflict)0x0;
    pBVar1 = this->currentBlock->byteCodeUpwardExposedUsed;
    BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar1);
    BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)&unusedPropertySym,pBVar1->head);
    local_b0 = (PropertySym *)0x0;
    GlobOpt::TrackByteCodeSymUsed(instr,this->currentBlock->byteCodeUpwardExposedUsed,&local_b0);
    local_68.alloc = this->tempAlloc;
    local_68.lastUsedNodePrevNextField = &local_68.head;
    local_68.head = (BVSparseNode *)0x0;
    local_68.lastFoundIndex = (Type_conflict)0x0;
    pBVar1 = this->currentBlock->byteCodeUpwardExposedUsed;
    BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar1);
    BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
              (&local_68,pBVar1->head);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (&local_68,(BVSparse<Memory::JitArenaAllocator> *)&unusedPropertySym);
    pBVar16 = local_68.head;
    if (local_68.head != (BVSparseNode *)0x0) {
      local_78 = instr;
      local_70 = this_02;
      local_38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        uVar18 = (pBVar16->data).word;
        local_40 = pBVar16;
        if (uVar18 != 0) {
          local_80 = (ulong)pBVar16->startIndex;
          uVar17 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar17);
            pSVar8 = SymTable::FindStackSym(this->func->m_symTable,(int)local_80 + (BVIndex)uVar17);
            if (pSVar8->m_type != TyVar) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_38 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1f55,"(stackSym->GetType() == TyVar)",
                                 "stackSym->GetType() == TyVar");
              if (!bVar4) goto LAB_003e9484;
              *local_38 = 0;
            }
            pFVar9 = StackSym::GetByteCodeFunc(pSVar8);
            if (pFVar9 == this->func) {
              RVar7 = StackSym::GetByteCodeRegSlot(pSVar8);
              if (RVar7 == 0xffffffff) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *local_38 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x1f5a,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                                   "byteCodeRegSlot != Js::Constants::NoRegister");
                if (!bVar4) goto LAB_003e9484;
                *local_38 = 0;
              }
              ppSVar10 = this->currentBlock->byteCodeRestoreSyms;
              if (ppSVar10[RVar7] != pSVar8) {
                if (ppSVar10[RVar7] != (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *local_38 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                     ,0x1f5e,
                                     "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                     ,
                                     "Can\'t have two active lifetime for the same byte code register"
                                    );
                  if (!bVar4) goto LAB_003e9484;
                  *local_38 = 0;
                  ppSVar10 = this->currentBlock->byteCodeRestoreSyms;
                }
                ppSVar10[RVar7] = pSVar8;
              }
            }
            uVar18 = uVar18 & ~(1L << (uVar17 & 0x3f));
            uVar17 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
          } while (uVar18 != 0);
        }
        pBVar16 = local_40->next;
      } while (pBVar16 != (Type)0x0);
      this_02 = local_70;
      instr = local_78;
      if (local_68.head != (BVSparseNode *)0x0) {
        pBVar16 = local_68.head;
        pBVar14 = (local_68.alloc)->bvFreeList;
        do {
          pBVar11 = pBVar16;
          pBVar16 = pBVar11->next;
          pBVar11->next = pBVar14;
          pBVar14 = pBVar11;
        } while (pBVar16 != (Type)0x0);
        (local_68.alloc)->bvFreeList = pBVar11;
      }
    }
    if (unusedPropertySym != (PropertySym *)0x0) {
      pPVar2 = unusedPropertySym;
      pPVar15 = (PropertySym *)local_98->bvFreeList;
      do {
        pPVar12 = pPVar2;
        pPVar2 = (PropertySym *)(pPVar12->super_Sym)._vptr_Sym;
        (pPVar12->super_Sym)._vptr_Sym = (_func_int **)pPVar15;
        pPVar15 = pPVar12;
      } while (pPVar2 != (PropertySym *)0x0);
      local_98->bvFreeList = (BVSparseNode *)pPVar12;
    }
  }
  if (this->preOpBailOutInstrToProcess != instr && this->preOpBailOutInstrToProcess != (Instr *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1f69,
                       "(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr)",
                       "!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr");
    if (!bVar4) goto LAB_003e9484;
    *puVar13 = 0;
  }
  this->preOpBailOutInstrToProcess = (Instr *)0x0;
  if ((this->tag == DeadStorePhase) && (bVar4 = SatisfyMarkTempObjectsConditions(this), bVar4)) {
    ObjectTempVerify::NotifyDeadStore
              (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this);
  }
  if (instr->m_opcode == ArgIn_A) {
    this_00 = instr->m_src1;
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_003e9484;
      *puVar13 = 0;
    }
    pSVar8 = (StackSym *)this_00[1]._vptr_Opnd;
    if ((pSVar8->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_003e9484;
      *puVar13 = 0;
    }
    AVar6 = StackSym::GetParamSlotNum(pSVar8);
    if (AVar6 == 1) {
      this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      bVar4 = JITTimeFunctionBody::IsAsmJsMode(this_01);
      if (!bVar4) goto LAB_003e945d;
    }
    pFVar9 = this->func;
    AVar6 = pFVar9->argInsCount;
    if (AVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1f7a,"(this->func->argInsCount > 0)","this->func->argInsCount > 0");
      if (!bVar4) {
LAB_003e9484:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar13 = 0;
      pFVar9 = this->func;
      AVar6 = pFVar9->argInsCount;
    }
    pFVar9->argInsCount = AVar6 - 1;
  }
LAB_003e945d:
  TraceDeadStoreOfInstrsForScopeObjectRemoval(this);
  BasicBlock::RemoveInstr(this_02,instr);
  return true;
}

Assistant:

bool
BackwardPass::DeadStoreInstr(IR::Instr *instr)
{
    BasicBlock * block = this->currentBlock;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("Deadstore instr: "));
        instr->Dump();
    }
    this->numDeadStore++;
#endif

    // Before we remove the dead store, we need to track the byte code uses
    if (this->DoByteCodeUpwardExposedUsed())
    {
#if DBG
        BVSparse<JitArenaAllocator> tempBv(this->tempAlloc);
        tempBv.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
#endif
        PropertySym *unusedPropertySym = nullptr;

        GlobOpt::TrackByteCodeSymUsed(instr, this->currentBlock->byteCodeUpwardExposedUsed, &unusedPropertySym);

#if DBG
        BVSparse<JitArenaAllocator> tempBv2(this->tempAlloc);
        tempBv2.Copy(this->currentBlock->byteCodeUpwardExposedUsed);
        tempBv2.Minus(&tempBv);
        FOREACH_BITSET_IN_SPARSEBV(symId, &tempBv2)
        {
            StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
            Assert(stackSym->GetType() == TyVar);
            // TODO: We can only track first level function stack syms right now
            if (stackSym->GetByteCodeFunc() == this->func)
            {
                Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                {
                    AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                        "Can't have two active lifetime for the same byte code register");
                    this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
#endif
    }

    // If this is a pre-op bailout instruction, we may have saved it for bailout info processing. It's being removed now, so no
    // need to process the bailout info anymore.
    Assert(!preOpBailOutInstrToProcess || preOpBailOutInstrToProcess == instr);
    preOpBailOutInstrToProcess = nullptr;

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyDeadStore(instr, this);
    }
#endif


    if (instr->m_opcode == Js::OpCode::ArgIn_A)
    {
        // Ignore tracking ArgIn for "this" as argInsCount only tracks other
        // params, unless it is a AsmJS function (which doesn't have a "this").
        if (instr->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() != 1 || func->GetJITFunctionBody()->IsAsmJsMode())
        {
            Assert(this->func->argInsCount > 0);
            this->func->argInsCount--;
        }
    }

    TraceDeadStoreOfInstrsForScopeObjectRemoval();

    block->RemoveInstr(instr);
    return true;
}